

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

XMLError __thiscall tinyxml2::XMLDocument::SaveFile(XMLDocument *this,char *filename,bool compact)

{
  FILE *__stream;
  char *pcVar1;
  
  __stream = fopen(filename,"w");
  if (__stream == (FILE *)0x0) {
    pcVar1 = "<null>";
    if (filename != (char *)0x0) {
      pcVar1 = filename;
    }
    SetError(this,XML_ERROR_FILE_COULD_NOT_BE_OPENED,0,"filename=%s",pcVar1);
  }
  else {
    SaveFile(this,(FILE *)__stream,compact);
    fclose(__stream);
  }
  return this->_errorID;
}

Assistant:

XMLError XMLDocument::SaveFile( const char* filename, bool compact )
{
    FILE* fp = callfopen( filename, "w" );
    if ( !fp ) {
        SetError( XML_ERROR_FILE_COULD_NOT_BE_OPENED, 0, "filename=%s", filename ? filename : "<null>");
        return _errorID;
    }
    SaveFile(fp, compact);
    fclose( fp );
    return _errorID;
}